

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

MemoryRegion *
memory_cow_arm(uc_struct_conflict1 *uc,MemoryRegion *current,hwaddr begin,size_t size)

{
  MemoryRegion *mr;
  RAMBlock *pRVar1;
  RAMBlock *pRVar2;
  bool bVar3;
  MemoryRegion *mr_00;
  MemoryRegion *pMVar4;
  ulong uVar5;
  long lVar6;
  hwaddr hVar7;
  
  mr_00 = (MemoryRegion *)g_malloc(0xa0);
  if (current->container == uc->system_memory) {
    hVar7 = current->addr;
    pMVar4 = (MemoryRegion *)g_malloc(0xa0);
    if (*(long *)((long)&current->size + 8) != 0) {
      __assert_fail("r == a",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/int128.h"
                    ,0x16,"uint64_t int128_get64(Int128)");
    }
    lVar6 = (long)current->size;
    memset(pMVar4,0,0xa0);
    pMVar4->uc = (uc_struct_conflict7 *)uc;
    pMVar4->ops = &unassigned_mem_ops_arm;
    pMVar4->enabled = true;
    pMVar4->destructor = memory_region_destructor_none;
    bVar3 = lVar6 == -1;
    if (bVar3) {
      lVar6 = 0;
    }
    (pMVar4->subregions).tqh_first = (MemoryRegion *)0x0;
    (pMVar4->subregions).tqh_circ.tql_prev = (QTailQLink *)&pMVar4->subregions;
    *(ulong *)((long)&pMVar4->size + 8) = (ulong)bVar3;
    *(long *)&pMVar4->size = lVar6;
    memory_region_del_subregion_arm(uc->system_memory,current);
    memory_region_add_subregion_common(pMVar4,0,current);
    mr = uc->system_memory;
    pMVar4->priority = 0;
    memory_region_add_subregion_common(mr,hVar7,pMVar4);
  }
  hVar7 = begin - current->container->addr;
  uVar5 = hVar7 - current->addr;
  memory_region_init_ram_arm(uc,mr_00,size,current->perms);
  if ((mr_00->addr == 0xffffffffffffffff) || (pRVar1 = mr_00->ram_block, pRVar1 == (RAMBlock *)0x0))
  {
    g_free(mr_00);
    mr_00 = (MemoryRegion *)0x0;
  }
  else {
    if ((((pRVar1->host == (uint8_t *)0x0) || (pRVar1->used_length == 0)) ||
        (pRVar2 = current->ram_block, pRVar2 == (RAMBlock *)0x0)) ||
       ((pRVar2->host == (uint8_t *)0x0 || (pRVar2->used_length <= uVar5)))) {
      __assert_fail("offset_in_ramblock(block, offset)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/exec/ram_addr.h"
                    ,0x22,"void *ramblock_ptr(RAMBlock *, ram_addr_t)");
    }
    memcpy(pRVar1->host,pRVar2->host + uVar5,size);
    pMVar4 = current->container;
    mr_00->priority = uc->snapshot_level;
    memory_region_add_subregion_common(pMVar4,hVar7,mr_00);
    if (uc->cpu != (CPUState *)0x0) {
      tlb_flush_arm(uc->cpu);
    }
    uc->memory_region_update_pending = true;
    memory_region_transaction_commit_arm(mr_00);
  }
  return mr_00;
}

Assistant:

MemoryRegion *memory_cow(struct uc_struct *uc, MemoryRegion *current, hwaddr begin, size_t size)
{
    hwaddr offset;
    hwaddr current_offset;
    MemoryRegion *ram = g_new(MemoryRegion, 1);

    if (current->container == uc->system_memory) {
        make_contained(uc, current);
    }
    offset = begin - current->container->addr;;
    current_offset = offset - current->addr;

    memory_region_init_ram(uc, ram, size, current->perms);
    if (ram->addr == -1 || !ram->ram_block) {
        g_free(ram);
        return NULL;
    }
    memory_region_transaction_begin();

    memcpy(ramblock_ptr(ram->ram_block, 0), ramblock_ptr(current->ram_block, current_offset), size);
    memory_region_add_subregion_overlap(current->container, offset, ram, uc->snapshot_level);

    if (uc->cpu) {
        tlb_flush(uc->cpu);
    }

    uc->memory_region_update_pending = true;
    memory_region_transaction_commit(ram);

    return ram;
}